

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O2

void S_ClearSoundData(void)

{
  FMusicVolume *block;
  long lVar1;
  FMusicVolume *me;
  ulong uVar2;
  
  S_StopAllChannels();
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < S_sfx.Count; uVar2 = uVar2 + 1) {
    S_UnloadSound((sfxinfo_t *)((long)&((S_sfx.Array)->data).data + lVar1));
    lVar1 = lVar1 + 0x50;
  }
  TArray<sfxinfo_t,_sfxinfo_t>::Clear(&S_sfx);
  TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::Clear(&Ambients,1);
  while (block = MusicVolumes, MusicVolumes != (FMusicVolume *)0x0) {
    MusicVolumes = MusicVolumes->Next;
    M_Free(block);
  }
  TArray<FRandomSoundList,_FRandomSoundList>::Clear(&S_rnd);
  NumPlayerReserves = 0;
  PlayerClassesIsSorted = 0;
  TArray<FPlayerClassLookup,_FPlayerClassLookup>::Clear(&PlayerClassLookups);
  TArray<FPlayerSoundHashTable,_FPlayerSoundHashTable>::Clear(&PlayerSounds);
  DefPlayerClass = 0;
  FString::operator=(&DefPlayerClassName,(char *)"");
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::Clear(&MusicAliases,1);
  TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>::Clear
            (&MidiDevices,1);
  TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::Clear(&HexenMusic,1);
  return;
}

Assistant:

static void S_ClearSoundData()
{
	unsigned int i;

	S_StopAllChannels();
	for (i = 0; i < S_sfx.Size(); ++i)
	{
		S_UnloadSound(&S_sfx[i]);
	}
	S_sfx.Clear();
	Ambients.Clear();
	while (MusicVolumes != NULL)
	{
		FMusicVolume *me = MusicVolumes;
		MusicVolumes = me->Next;
		M_Free(me);
	}
	S_rnd.Clear();

	NumPlayerReserves = 0;
	PlayerClassesIsSorted = false;
	PlayerClassLookups.Clear();
	PlayerSounds.Clear();
	DefPlayerClass = 0;
	DefPlayerClassName = "";
	MusicAliases.Clear();
	MidiDevices.Clear();
	HexenMusic.Clear();
}